

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.cpp
# Opt level: O0

bool add_packed_varyings(gl_context *ctx,gl_shader_program *shProg,set *resource_set,int stage,
                        GLenum type)

{
  int iVar1;
  gl_linked_shader *pgVar2;
  exec_node *peVar3;
  char *name;
  glsl_type *type_00;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  ir_variable *var_00;
  ir_variable *local_d0;
  ir_variable *local_c8;
  ir_variable *local_80;
  ir_variable *local_78;
  int stage_mask;
  ir_variable *var;
  ir_instruction *node;
  GLenum iface;
  gl_linked_shader *sh;
  GLenum type_local;
  int stage_local;
  set *resource_set_local;
  gl_shader_program *shProg_local;
  gl_context *ctx_local;
  
  pgVar2 = shProg->_LinkedShaders[stage];
  if ((pgVar2 != (gl_linked_shader *)0x0) && (pgVar2->packed_varyings != (exec_list *)0x0)) {
    bVar4 = exec_node_is_tail_sentinel((pgVar2->packed_varyings->head_sentinel).next);
    if (bVar4) {
      local_80 = (ir_variable *)0x0;
    }
    else {
      peVar3 = (pgVar2->packed_varyings->head_sentinel).next;
      if (peVar3 == (exec_node *)0x0) {
        local_78 = (ir_variable *)0x0;
      }
      else {
        local_78 = (ir_variable *)&peVar3[-1].prev;
      }
      local_80 = local_78;
    }
    var = local_80;
    while (var != (ir_variable *)0x0) {
      var_00 = ir_instruction::as_variable(&var->super_ir_instruction);
      if (var_00 != (ir_variable *)0x0) {
        uVar6 = *(uint *)&var_00->data >> 0xc & 0xf;
        if (uVar6 == 4) {
          node._4_4_ = 0x92e3;
        }
        else {
          if (uVar6 != 5) {
            __assert_fail("!\"unexpected type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/linker.cpp"
                          ,0xf97,
                          "bool add_packed_varyings(const struct gl_context *, struct gl_shader_program *, struct set *, int, GLenum)"
                         );
          }
          node._4_4_ = 0x92e4;
        }
        if (type == node._4_4_) {
          bVar5 = build_stageref(shProg,var_00->name,*(uint *)&var_00->data >> 0xc & 0xf);
          name = var_00->name;
          type_00 = var_00->type;
          iVar1 = (var_00->data).location;
          bVar4 = inout_has_same_location(var_00,stage);
          bVar4 = add_shader_variable(ctx,shProg,resource_set,(uint)bVar5,node._4_4_,var_00,name,
                                      type_00,false,iVar1 + -0x20,bVar4,(glsl_type *)0x0);
          if (!bVar4) {
            return false;
          }
        }
      }
      bVar4 = exec_node_is_tail_sentinel((var->super_ir_instruction).super_exec_node.next);
      if (bVar4) {
        local_d0 = (ir_variable *)0x0;
      }
      else {
        peVar3 = (var->super_ir_instruction).super_exec_node.next;
        if (peVar3 == (exec_node *)0x0) {
          local_c8 = (ir_variable *)0x0;
        }
        else {
          local_c8 = (ir_variable *)&peVar3[-1].prev;
        }
        local_d0 = local_c8;
      }
      var = local_d0;
    }
  }
  return true;
}

Assistant:

static bool
add_packed_varyings(const struct gl_context *ctx,
                    struct gl_shader_program *shProg,
                    struct set *resource_set,
                    int stage, GLenum type)
{
   struct gl_linked_shader *sh = shProg->_LinkedShaders[stage];
   GLenum iface;

   if (!sh || !sh->packed_varyings)
      return true;

   foreach_in_list(ir_instruction, node, sh->packed_varyings) {
      ir_variable *var = node->as_variable();
      if (var) {
         switch (var->data.mode) {
         case ir_var_shader_in:
            iface = GL_PROGRAM_INPUT;
            break;
         case ir_var_shader_out:
            iface = GL_PROGRAM_OUTPUT;
            break;
         default:
            unreachable("unexpected type");
         }

         if (type == iface) {
            const int stage_mask =
               build_stageref(shProg, var->name, var->data.mode);
            if (!add_shader_variable(ctx, shProg, resource_set,
                                     stage_mask,
                                     iface, var, var->name, var->type, false,
                                     var->data.location - VARYING_SLOT_VAR0,
                                     inout_has_same_location(var, stage)))
               return false;
         }
      }
   }
   return true;
}